

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdpfor.h
# Opt level: O2

uint32_t FastPForLib::SIMDPFor::determineBestBase(DATATYPE *in,size_t size)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint32_t k;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  size_t sVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined8 in_XMM8_Qa;
  undefined8 in_XMM8_Qb;
  uint32_t freqs [33];
  
  if (size != 0) {
    for (lVar7 = 0; lVar7 != 0x21; lVar7 = lVar7 + 1) {
      freqs[lVar7] = 0;
    }
    uVar9 = 0;
    sVar11 = 0x10000;
    if (size < 0x10000) {
      sVar11 = size;
    }
    if (0x10000 < size) {
      uVar6 = rand();
      uVar9 = (ulong)uVar6 % (ulong)(uint)((int)size - (int)sVar11);
    }
    uVar8 = uVar9 + sVar11;
    for (; uVar9 < uVar8; uVar9 = (ulong)((int)uVar9 + 1)) {
      uVar6 = in[uVar9];
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        iVar10 = 0x1f;
        if (uVar6 != 0) {
          for (; uVar6 >> iVar10 == 0; iVar10 = iVar10 + -1) {
          }
        }
        uVar6 = iVar10 + 1;
      }
      freqs[uVar6] = freqs[uVar6] + 1;
    }
    iVar10 = 0;
    uVar9 = 0x20;
    uVar8 = 0x20;
    auVar12 = ZEXT816(0x4040000000000000);
    while( true ) {
      uVar1 = uVar8 - 1;
      uVar6 = (uint)uVar1;
      if (0x1f < uVar6) break;
      iVar10 = iVar10 + freqs[uVar8];
      auVar4._8_8_ = in_XMM8_Qb;
      auVar4._0_8_ = in_XMM8_Qa;
      auVar4 = vcvtusi2sd_avx512f(auVar4,iVar10);
      auVar14._0_8_ = auVar4._0_8_ / (double)(long)sVar11;
      auVar14._8_8_ = auVar4._8_8_;
      if (iVar10 != 0) {
        auVar16 = vfmadd213sd_fma(ZEXT816(0x4060000000000000),auVar14,ZEXT816(0xbff0000000000000));
        auVar5._8_8_ = in_XMM8_Qb;
        auVar5._0_8_ = in_XMM8_Qa;
        auVar4 = vcvtusi2sd_avx512f(auVar5,1 << (uVar6 & 0x1f));
        auVar15._0_8_ = auVar16._0_8_ / (auVar14._0_8_ * auVar4._0_8_);
        auVar15._8_8_ = auVar16._8_8_;
        auVar14 = vmaxsd_avx(auVar15,auVar14);
      }
      auVar16._0_8_ = (double)(int)uVar6;
      auVar16._8_8_ = in_XMM8_Qb;
      auVar14 = vfmadd231sd_fma(auVar16,auVar14,ZEXT816(0x4040000000000000));
      dVar13 = auVar12._0_8_;
      uVar2 = vcmpsd_avx512f(auVar14,auVar12,6);
      bVar3 = (bool)((byte)uVar2 & 1);
      auVar12._0_8_ = (ulong)bVar3 * (long)dVar13 + (ulong)!bVar3 * (long)auVar14._0_8_;
      auVar12._8_8_ = auVar14._8_8_;
      if (auVar14._0_8_ <= dVar13) {
        uVar9 = uVar1;
      }
      uVar9 = uVar9 & 0xffffffff;
      uVar8 = uVar1;
    }
    return (uint32_t)uVar9;
  }
  return 0;
}

Assistant:

static uint32_t determineBestBase(const DATATYPE *in, size_t size) {
    if (size == 0)
      return 0;
    const size_t defaultsamplesize = 64 * 1024;
    // the original paper describes sorting
    // a sample, but this only makes sense if you
    // are coding a frame of reference.
    size_t samplesize = size > defaultsamplesize ? defaultsamplesize : size;
    uint32_t freqs[33];
    for (uint32_t k = 0; k <= 32; ++k)
      freqs[k] = 0;
    // we choose the sample to be consecutive
    uint32_t rstart =
        size > samplesize
            ? (rand() % (static_cast<uint32_t>(size - samplesize)))
            : 0U;
    for (uint32_t k = rstart; k < rstart + samplesize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    uint32_t bestb = 32;
    uint32_t numberofexceptions = 0;
    double Erate = 0;
    double bestcost = 32;
    for (uint32_t b = bestb - 1; b < 32; --b) {
      numberofexceptions += freqs[b + 1];
      Erate = static_cast<double>(numberofexceptions) /
              static_cast<double>(samplesize);
      /**
      * though this is not explicit in the original paper, you
      * need to somehow compensate for compulsory exceptions
      * when the chosen number of bits is small.
      *
      * We use their formula (3.1.5) to estimate actual number
      * of total exceptions, including compulsory exceptions.
      */
      if (numberofexceptions > 0) {
        double altErate = (Erate * 128 - 1) / (Erate * (1U << b));
        if (altErate > Erate)
          Erate = altErate;
      }
      const double thiscost = b + Erate * 32;
      if (thiscost <= bestcost) {
        bestcost = thiscost;
        bestb = b;
      }
    }
    return bestb;
  }